

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

BinOpr expr_binop(LexState *ls,ExpDesc *v,uint32_t limit)

{
  int iVar1;
  BCPos BVar2;
  ExpKind EVar3;
  anon_union_8_3_2ce71dea_for_u aVar4;
  BCPos BVar5;
  BinOpr BVar6;
  undefined4 uVar7;
  BCReg BVar8;
  BCReg BVar9;
  BCReg BVar10;
  undefined8 uVar11;
  TValue TVar12;
  ulong uVar13;
  uint32_t uVar14;
  BinOpr BVar15;
  uint uVar16;
  BCPos *l1;
  ExpDesc *pEVar17;
  BCIns ins;
  TValue *o;
  FuncState *pFVar18;
  GCstr *pGVar19;
  ExpDesc v2;
  ExpDesc *local_40;
  
  synlevel_begin(ls);
  iVar1 = ls->token;
  switch(iVar1) {
  case 0x107:
    uVar11 = 0xffffffff00000001;
    goto LAB_00118429;
  case 0x108:
  case 0x10a:
  case 0x10b:
  case 0x10c:
  case 0x10d:
switchD_00118360_caseD_108:
    expr_primary(ls,v);
    break;
  case 0x109:
    lj_lex_next(ls);
    parse_body(ls,v,0,ls->linenumber);
    break;
  case 0x10e:
    uVar11 = 0xffffffff00000000;
LAB_00118429:
    v->k = (int)uVar11;
    v->t = (int)((ulong)uVar11 >> 0x20);
    (v->u).s.info = 0;
    v->f = 0xffffffff;
LAB_001184cf:
    lj_lex_next(ls);
    break;
  case 0x10f:
    lj_lex_next(ls);
    expr_binop(ls,v,8);
    pFVar18 = ls->fs;
    BVar5 = v->t;
    BVar2 = v->f;
    v->f = BVar5;
    v->t = BVar2;
    jmp_dropval(pFVar18,BVar5);
    jmp_dropval(pFVar18,v->t);
    expr_discharge(pFVar18,v);
    EVar3 = v->k;
    if (EVar3 < VKTRUE) {
      v->k = VKTRUE;
    }
    else if (EVar3 - VKTRUE < 4) {
      v->k = VKFALSE;
    }
    else if (EVar3 == VJMP) {
      *(byte *)&pFVar18->bcbase[(v->u).s.info - 1].ins =
           (byte)pFVar18->bcbase[(v->u).s.info - 1].ins ^ 1;
    }
    else {
      uVar16 = 0x11;
      if (EVar3 == VRELOCABLE) {
        bcreg_reserve(pFVar18,1);
        *(char *)((long)&pFVar18->bcbase[(v->u).s.info].ins + 1) = (char)pFVar18->freereg + -1;
        (v->u).s.info = pFVar18->freereg - 1;
        v->k = VNONRELOC;
      }
LAB_001185ad:
      expr_free(pFVar18,v);
      BVar5 = bcemit_INS(pFVar18,(v->u).s.info << 0x10 | uVar16);
      (v->u).s.info = BVar5;
      v->k = VRELOCABLE;
    }
    break;
  default:
    if (iVar1 == 0x120) {
      v->k = VKSTR;
      v->t = 0xffffffff;
      (v->u).s.info = 0;
      v->f = 0xffffffff;
      TVar12.field_2.it = 0;
      TVar12.field_2.field_0 =
           (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)
           (ls->tokenval).u32.lo;
LAB_001184cc:
      v->u = (anon_union_8_3_2ce71dea_for_u)TVar12;
    }
    else {
      if (iVar1 == 0x2d) {
        lj_lex_next(ls);
        expr_binop(ls,v,8);
        pFVar18 = ls->fs;
        uVar16 = 0x12;
        if (v->t != v->f) {
LAB_001185a2:
          expr_toanyreg(pFVar18,v);
          goto LAB_001185ad;
        }
        if (v->k == VKLAST) {
          if (((ulong)(v->u).sval & 0x7fffffffffffffff) == 0) goto LAB_001185a2;
          (v->u).sval = (GCstr *)((ulong)(v->u).sval ^ 0x8000000000000000);
        }
        else {
          if (v->k != VKCDATA) goto LAB_001185a2;
          uVar13 = (ulong)(v->u).s.info;
          if (*(short *)(uVar13 + 6) == 0x10) {
            *(byte *)(uVar13 + 0x17) = *(byte *)(uVar13 + 0x17) ^ 0x80;
          }
          else {
            *(long *)(uVar13 + 8) = -*(long *)(uVar13 + 8);
          }
        }
        break;
      }
      if (iVar1 == 0x7b) {
        expr_table(ls,v);
        break;
      }
      if (iVar1 == 0x114) {
        uVar11 = 0xffffffff00000002;
        goto LAB_00118429;
      }
      if (iVar1 != 0x118) {
        if (iVar1 != 0x11e) {
          if (iVar1 != 0x23) goto switchD_00118360_caseD_108;
          lj_lex_next(ls);
          expr_binop(ls,v,8);
          pFVar18 = ls->fs;
          uVar16 = 0x13;
          goto LAB_001185a2;
        }
        v->k = (ls->tokenval).field_2.it == 0xfffffff5 | VKLAST;
        (v->u).s.info = 0;
        v->t = 0xffffffff;
        v->f = 0xffffffff;
        TVar12 = ls->tokenval;
        goto LAB_001184cc;
      }
      pFVar18 = ls->fs;
      if ((pFVar18->flags & 2) == 0) {
        err_syntax(ls,LJ_ERR_XDOTS);
      }
      bcreg_reserve(pFVar18,1);
      uVar14 = pFVar18->freereg - 1;
      BVar5 = bcemit_INS(pFVar18,(uint)pFVar18->numparams << 0x10 | uVar14 * 0x100 | 0x2000043);
      v->k = VCALL;
      (v->u).s.info = BVar5;
      v->t = 0xffffffff;
      v->f = 0xffffffff;
      (v->u).s.aux = uVar14;
    }
    goto LAB_001184cf;
  }
  iVar1 = ls->token;
  switch(iVar1) {
  case 0x110:
    BVar15 = OPR_OR;
    break;
  case 0x111:
  case 0x112:
  case 0x113:
  case 0x114:
  case 0x115:
  case 0x116:
  case 0x118:
    goto switchD_001185f7_caseD_26;
  case 0x117:
    BVar15 = OPR_CONCAT;
    break;
  case 0x119:
    BVar15 = OPR_EQ;
    break;
  case 0x11a:
    BVar15 = OPR_GE;
    break;
  case 0x11b:
    BVar15 = OPR_LE;
    break;
  case 0x11c:
    BVar15 = OPR_NE;
    break;
  default:
    switch(iVar1) {
    case 0x25:
      BVar15 = OPR_MOD;
      break;
    case 0x2a:
      BVar15 = OPR_MUL;
      break;
    case 0x2b:
      BVar15 = OPR_ADD;
      break;
    case 0x2d:
      BVar15 = OPR_SUB;
      break;
    case 0x2f:
      BVar15 = OPR_DIV;
      break;
    default:
      if (iVar1 == 0x3c) {
        BVar15 = OPR_LT;
        break;
      }
      if (iVar1 == 0x3e) {
        BVar15 = OPR_GT;
        break;
      }
      if (iVar1 == 0x5e) {
        BVar15 = OPR_POW;
        break;
      }
      if (iVar1 == 0x101) {
        BVar15 = OPR_AND;
        break;
      }
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
switchD_001185f7_caseD_26:
      BVar15 = OPR_NOBINOPR;
    }
  }
LAB_0011866e:
  do {
    if ((BVar15 == OPR_NOBINOPR) || (priority[BVar15].left <= limit)) {
      ls->level = ls->level - 1;
      return BVar15;
    }
    lj_lex_next(ls);
    pFVar18 = ls->fs;
    if (BVar15 == OPR_CONCAT) {
      expr_tonextreg(pFVar18,v);
    }
    else if (BVar15 == OPR_OR) {
      expr_discharge(pFVar18,v);
      EVar3 = v->k;
      if (EVar3 - VKTRUE < 3) {
        expr_toreg_nobranch(pFVar18,v,0xff);
        BVar5 = bcemit_jmp(pFVar18);
      }
      else {
        BVar5 = 0xffffffff;
        if (VKFALSE < EVar3) {
          if (EVar3 == VJMP) {
            BVar5 = (v->u).s.info;
          }
          else {
            BVar5 = bcemit_branch(pFVar18,v,1);
          }
        }
      }
      jmp_append(pFVar18,&v->t,BVar5);
      jmp_tohere(pFVar18,v->f);
      v->f = 0xffffffff;
    }
    else if (BVar15 == OPR_AND) {
      bcemit_branch_t(pFVar18,v);
    }
    else {
      if (BVar15 - OPR_NE < 2) {
        if (v->k < VKCDATA) {
LAB_00118702:
          if (v->t == v->f) goto LAB_00118761;
        }
      }
      else if (v->k == VKLAST) goto LAB_00118702;
      expr_toanyreg(pFVar18,v);
    }
LAB_00118761:
    BVar6 = expr_binop(ls,&v2,(uint)priority[BVar15].right);
    pFVar18 = ls->fs;
    if (BVar15 < OPR_CONCAT) {
      if ((((v->k == VKLAST) && (v->t == v->f)) && (v2.k == VKLAST)) &&
         ((v2.t == v2.f &&
          (pGVar19 = (GCstr *)lj_vm_foldarith((v->u).sval,CONCAT44(v2.u.s.aux,v2.u.s.info),BVar15),
          ((ulong)pGVar19 & 0x7fffffffffffffff) < 0x7ff0000000000001)))) {
        (v->u).sval = pGVar19;
        BVar15 = BVar6;
      }
      else {
        if (BVar15 == OPR_POW) {
          BVar8 = expr_toanyreg(pFVar18,&v2);
          BVar9 = expr_toanyreg(pFVar18,v);
          uVar16 = 0x23;
        }
        else {
          expr_toval(pFVar18,&v2);
          if ((v2.k == VKLAST) && (BVar10 = const_num(pFVar18,&v2), BVar10 < 0x100)) {
            uVar16 = BVar15 + 0x14;
          }
          else {
            uVar16 = BVar15 + 0x1e;
            BVar10 = expr_toanyreg(pFVar18,&v2);
          }
          expr_toval(pFVar18,v);
          if (((v->k == VKLAST) && (v2.k != VKLAST)) &&
             (BVar8 = const_num(pFVar18,v), BVar8 < 0x100)) {
            uVar16 = uVar16 - 5;
            BVar9 = BVar10;
          }
          else {
            BVar9 = expr_toanyreg(pFVar18,v);
            BVar8 = BVar10;
          }
        }
        if ((v->k == VNONRELOC) && (pFVar18->nactvar <= (v->u).s.info)) {
          pFVar18->freereg = pFVar18->freereg - 1;
        }
        if ((v2.k == VNONRELOC) && (pFVar18->nactvar <= v2.u.s.info)) {
          pFVar18->freereg = pFVar18->freereg - 1;
        }
        BVar5 = bcemit_INS(pFVar18,BVar8 << 0x10 | BVar9 << 0x18 | uVar16);
        (v->u).s.info = BVar5;
        v->k = VRELOCABLE;
        BVar15 = BVar6;
      }
      goto LAB_0011866e;
    }
    if (BVar15 != OPR_CONCAT) {
      if (BVar15 == OPR_OR) {
        expr_discharge(pFVar18,&v2);
        BVar5 = v->t;
        l1 = &v2.t;
      }
      else {
        if (BVar15 != OPR_AND) {
          expr_toval(pFVar18,v);
          pEVar17 = v;
          local_40 = &v2;
          if (BVar15 - OPR_NE < 2) {
            uVar16 = BVar15 == OPR_EQ ^ 5;
            if (v->k < VKCDATA) {
              pEVar17 = &v2;
              local_40 = v;
            }
            BVar8 = expr_toanyreg(pFVar18,pEVar17);
            expr_toval(pFVar18,local_40);
            EVar3 = local_40->k;
            if (EVar3 < VKSTR) {
              ins = EVar3 << 0x10 | uVar16 + BVar8 * 0x100 + 6;
            }
            else if (EVar3 == VKSTR) {
              BVar9 = const_str(pFVar18,local_40);
              ins = (BVar9 << 0x10 | BVar8 << 8) + uVar16 + 2;
            }
            else if (EVar3 == VKLAST) {
              BVar9 = const_num(pFVar18,local_40);
              ins = BVar9 << 0x10 | uVar16 + BVar8 * 0x100 + 4;
            }
            else {
              BVar9 = expr_toanyreg(pFVar18,local_40);
              ins = BVar9 << 0x10 | BVar8 * 0x100 | uVar16;
            }
          }
          else {
            uVar16 = BVar15 - OPR_LT;
            if ((uVar16 & 1) != 0) {
              uVar16 = uVar16 ^ 3;
              expr_toval(pFVar18,&v2);
              local_40 = v;
              pEVar17 = &v2;
            }
            BVar8 = expr_toanyreg(pFVar18,local_40);
            BVar9 = expr_toanyreg(pFVar18,pEVar17);
            ins = BVar8 << 0x10 | uVar16 | BVar9 << 8;
          }
          if ((pEVar17->k == VNONRELOC) && (pFVar18->nactvar <= (pEVar17->u).s.info)) {
            pFVar18->freereg = pFVar18->freereg - 1;
          }
          if ((local_40->k == VNONRELOC) && (pFVar18->nactvar <= (local_40->u).s.info)) {
            pFVar18->freereg = pFVar18->freereg - 1;
          }
          bcemit_INS(pFVar18,ins);
          BVar5 = bcemit_jmp(pFVar18);
          (v->u).s.info = BVar5;
          v->k = VJMP;
          BVar15 = BVar6;
          goto LAB_0011866e;
        }
        expr_discharge(pFVar18,&v2);
        BVar5 = v->f;
        l1 = &v2.f;
      }
      jmp_append(pFVar18,l1,BVar5);
      *(ulong *)&v->f = CONCAT44(v2._20_4_,v2.f);
      aVar4.s.aux = v2.u.s.aux;
      aVar4.s.info = v2.u.s.info;
      v->u = aVar4;
      v->k = v2.k;
      v->t = v2.t;
      BVar15 = BVar6;
      goto LAB_0011866e;
    }
    expr_toval(pFVar18,&v2);
    if ((v2.k == VRELOCABLE) && ((char)pFVar18->bcbase[v2.u.s.info].ins == '$')) {
      expr_free(pFVar18,v);
      *(undefined1 *)((long)&pFVar18->bcbase[v2.u.s.info].ins + 3) = *(undefined1 *)&v->u;
      uVar7 = v2.u.s.info;
    }
    else {
      expr_tonextreg(pFVar18,&v2);
      if ((v2.k == VNONRELOC) && (pFVar18->nactvar <= v2.u.s.info)) {
        pFVar18->freereg = pFVar18->freereg - 1;
      }
      expr_free(pFVar18,v);
      uVar7 = bcemit_INS(pFVar18,v2.u.s.info << 0x10 | (v->u).s.info << 0x18 | 0x24);
    }
    (v->u).s.info = uVar7;
    v->k = VRELOCABLE;
    BVar15 = BVar6;
  } while( true );
}

Assistant:

static BinOpr expr_binop(LexState *ls, ExpDesc *v, uint32_t limit)
{
  BinOpr op;
  synlevel_begin(ls);
  expr_unop(ls, v);
  op = token2binop(ls->token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    ExpDesc v2;
    BinOpr nextop;
    lj_lex_next(ls);
    bcemit_binop_left(ls->fs, op, v);
    /* Parse binary expression with higher priority. */
    nextop = expr_binop(ls, &v2, priority[op].right);
    bcemit_binop(ls->fs, op, v, &v2);
    op = nextop;
  }
  synlevel_end(ls);
  return op;  /* Return unconsumed binary operator (if any). */
}